

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool xla::ForwardDFS(Rep *r,int32_t n,int32_t upper_bound)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *this;
  reference piVar5;
  Node *nw;
  const_iterator cStack_48;
  int w;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  NodeIO *nn_io;
  Node *nn;
  int32_t upper_bound_local;
  int32_t n_local;
  Rep *r_local;
  
  nn._0_4_ = upper_bound;
  nn._4_4_ = n;
  _upper_bound_local = r;
  std::vector<int,_std::allocator<int>_>::clear(&r->deltaf_);
  std::vector<int,_std::allocator<int>_>::clear(&_upper_bound_local->stack_);
  std::vector<int,_std::allocator<int>_>::push_back
            (&_upper_bound_local->stack_,(value_type_conflict1 *)((long)&nn + 4));
  do {
    do {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(&_upper_bound_local->stack_);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return true;
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::back(&_upper_bound_local->stack_);
      nn._4_4_ = *pvVar2;
      std::vector<int,_std::allocator<int>_>::pop_back(&_upper_bound_local->stack_);
      pvVar3 = std::
               vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ::operator[](&_upper_bound_local->nodes_,(long)nn._4_4_);
    } while ((pvVar3->visited & 1U) != 0);
    pvVar3->visited = true;
    std::vector<int,_std::allocator<int>_>::push_back
              (&_upper_bound_local->deltaf_,(value_type_conflict1 *)((long)&nn + 4));
    pvVar4 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&_upper_bound_local->node_io_,(long)nn._4_4_);
    this = OrderedSet<int>::GetSequence(&pvVar4->out);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this);
    cStack_48 = std::vector<int,_std::allocator<int>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar1) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      nw._4_4_ = *piVar5;
      pvVar3 = std::
               vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ::operator[](&_upper_bound_local->nodes_,(long)nw._4_4_);
      if (pvVar3->rank == (int32_t)nn) {
        return false;
      }
      if (((pvVar3->visited & 1U) == 0) && (pvVar3->rank < (int32_t)nn)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&_upper_bound_local->stack_,(value_type_conflict1 *)((long)&nw + 4));
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  } while( true );
}

Assistant:

static bool ForwardDFS(GraphCycles::Rep* r, int32_t n, int32_t upper_bound) {
  // Avoid recursion since stack space might be limited.
  // We instead keep a stack of nodes to visit.
  r->deltaf_.clear();
  r->stack_.clear();
  r->stack_.push_back(n);
  while (!r->stack_.empty()) {
    n = r->stack_.back();
    r->stack_.pop_back();
    Node* nn = &r->nodes_[n];
    if (nn->visited) continue;

    nn->visited = true;
    r->deltaf_.push_back(n);

    NodeIO* nn_io = &r->node_io_[n];
    for (auto w : nn_io->out.GetSequence()) {
      Node* nw = &r->nodes_[w];
      if (nw->rank == upper_bound) {
        return false;  // Cycle
      }
      if (!nw->visited && nw->rank < upper_bound) {
        r->stack_.push_back(w);
      }
    }
  }
  return true;
}